

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

int xz_lzma_bidder_init(archive_read_filter *self)

{
  int ret_00;
  archive_read_filter *self_00;
  void *__ptr;
  long in_RDI;
  int ret;
  private_data_conflict1 *state;
  void *out_block;
  int local_4;
  
  self_00 = (archive_read_filter *)calloc(0xb8,1);
  __ptr = malloc(0x10000);
  if ((self_00 == (archive_read_filter *)0x0) || (__ptr == (void *)0x0)) {
    archive_set_error(*(archive **)(in_RDI + 0x18),0xc,"Can\'t allocate data for xz decompression");
    free(__ptr);
    free(self_00);
    local_4 = -0x1e;
  }
  else {
    *(archive_read_filter **)(in_RDI + 0x50) = self_00;
    self_00->client_total = 0x10000;
    self_00->client_buff = __ptr;
    *(code **)(in_RDI + 0x28) = xz_filter_read;
    *(undefined8 *)(in_RDI + 0x30) = 0;
    *(code **)(in_RDI + 0x40) = xz_filter_close;
    self_00->bidder = (archive_read_filter_bidder *)0x0;
    self_00->archive = (archive_read *)self_00->client_buff;
    self_00->open = (_func_int_archive_read_filter_ptr *)self_00->client_total;
    *(undefined4 *)((long)&self_00->client_avail + 4) = 0;
    if (*(int *)(in_RDI + 0x60) == 9) {
      *(undefined1 *)((long)&self_00->client_avail + 1) = 0;
      local_4 = 0;
    }
    else {
      *(undefined1 *)((long)&self_00->client_avail + 1) = 1;
      if (*(int *)(in_RDI + 0x60) == 6) {
        ret_00 = lzma_stream_decoder(self_00,0xffffffffffffffff,8);
      }
      else {
        ret_00 = lzma_alone_decoder(self_00,0xffffffffffffffff);
      }
      if (ret_00 == 0) {
        local_4 = 0;
      }
      else {
        set_error(self_00,ret_00);
        free(self_00->client_buff);
        free(self_00);
        *(undefined8 *)(in_RDI + 0x50) = 0;
        local_4 = -0x1e;
      }
    }
  }
  return local_4;
}

Assistant:

static int
xz_lzma_bidder_init(struct archive_read_filter *self)
{
	static const size_t out_block_size = 64 * 1024;
	void *out_block;
	struct private_data *state;
	int ret;

	state = (struct private_data *)calloc(sizeof(*state), 1);
	out_block = (unsigned char *)malloc(out_block_size);
	if (state == NULL || out_block == NULL) {
		archive_set_error(&self->archive->archive, ENOMEM,
		    "Can't allocate data for xz decompression");
		free(out_block);
		free(state);
		return (ARCHIVE_FATAL);
	}

	self->data = state;
	state->out_block_size = out_block_size;
	state->out_block = out_block;
	self->read = xz_filter_read;
	self->skip = NULL; /* not supported */
	self->close = xz_filter_close;

	state->stream.avail_in = 0;

	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	state->crc32 = 0;
	if (self->code == ARCHIVE_FILTER_LZIP) {
		/*
		 * We have to read a lzip header and use it to initialize
		 * compression library, thus we cannot initialize the
		 * library for lzip here.
		 */
		state->in_stream = 0;
		return (ARCHIVE_OK);
	} else
		state->in_stream = 1;

	/* Initialize compression library. */
	if (self->code == ARCHIVE_FILTER_XZ)
		ret = lzma_stream_decoder(&(state->stream),
		    LZMA_MEMLIMIT,/* memlimit */
		    LZMA_CONCATENATED);
	else
		ret = lzma_alone_decoder(&(state->stream),
		    LZMA_MEMLIMIT);/* memlimit */

	if (ret == LZMA_OK)
		return (ARCHIVE_OK);

	/* Library setup failed: Choose an error message and clean up. */
	set_error(self, ret);

	free(state->out_block);
	free(state);
	self->data = NULL;
	return (ARCHIVE_FATAL);
}